

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O0

void __thiscall xray_re::xr_mesh_builder::create_edges(xr_mesh_builder *this,bool calc_smoothness)

{
  uint32_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  size_type sVar4;
  pointer pbVar5;
  reference pvVar6;
  reference face;
  bool local_89;
  b_edge local_5c;
  value_type local_4c;
  b_edge *pbStack_48;
  uint32_t next;
  b_edge *edge;
  uint_fast32_t v1;
  uint_fast32_t v0;
  uint_fast32_t i;
  b_face_vec_it end;
  b_face_vec_it it;
  uint32_t face_idx;
  bool calc_smoothness_local;
  xr_mesh_builder *this_local;
  
  sVar4 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::size
                    (&(this->super_xr_mesh).m_points);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::assign
            (&this->m_vertex_edges,sVar4,&BAD_IDX);
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  clear(&this->m_edges);
  sVar4 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::size
                    (&(this->super_xr_mesh).m_points);
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  reserve(&this->m_edges,sVar4);
  it._M_current._0_4_ = 0;
  end._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       begin(&this->m_faces);
  i = (uint_fast32_t)
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      end(&this->m_faces);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                             *)&i);
    if (!bVar2) break;
    v0 = 3;
    pbVar5 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end);
    edge = (b_edge *)(ulong)(pbVar5->field_0).field_0.v[0];
    while (v0 != 0) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
               ::operator->(&end);
      v1 = (uint_fast32_t)*(uint *)((long)pbVar5 + v0 * 4 + -4);
      v0 = v0 - 1;
      pbStack_48 = find_edge(this,v1,(uint_fast32_t)edge);
      if (pbStack_48 == (b_edge *)0x0) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                 ::operator->(&end);
        *(undefined4 *)((long)&pbVar5->field_0 + v0 * 4 + 0x24) = 0xffffffff;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->m_vertex_edges,v1);
        local_4c = *pvVar6;
        sVar4 = std::
                vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
                ::size(&this->m_edges);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->m_vertex_edges,v1);
        *pvVar6 = (value_type)sVar4;
        b_edge::b_edge(&local_5c,(uint_fast32_t)edge,(ulong)(uint)it._M_current,(ulong)local_4c);
        std::
        vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
        ::push_back(&this->m_edges,&local_5c);
      }
      else {
        uVar1 = pbStack_48->face0;
        pbVar5 = __gnu_cxx::
                 __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                 ::operator->(&end);
        *(uint32_t *)((long)&pbVar5->field_0 + v0 * 4 + 0x24) = uVar1;
        if (calc_smoothness) {
          uVar3 = pbStack_48->size + 1;
          pbStack_48->size = uVar3;
          if (uVar3 == 2) {
            pbVar5 = __gnu_cxx::
                     __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                     ::operator->(&end);
            face = std::
                   vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                   ::operator[](&this->m_faces,(ulong)pbStack_48->face0);
            local_89 = b_face::is_edge_smooth(pbVar5,face,v1,(uint_fast32_t)edge);
          }
          else {
            local_89 = false;
          }
          pbStack_48->smooth = local_89;
        }
        else {
          pbStack_48->size = pbStack_48->size + 1;
        }
        pbStack_48->face0 = (uint)it._M_current;
      }
      edge = (b_edge *)v1;
    }
    __gnu_cxx::
    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
    ::operator++(&end);
    it._M_current._0_4_ = (uint)it._M_current + 1;
  }
  return;
}

Assistant:

void xr_mesh_builder::create_edges(bool calc_smoothness)
{
	m_vertex_edges.assign(m_points.size(), BAD_IDX);
	m_edges.clear();
	m_edges.reserve(m_points.size());
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		for (uint_fast32_t i = 3, v0, v1 = it->v0; i != 0; v1 = v0) {
			b_edge* edge = find_edge(v0 = it->v[--i], v1);
			if (edge == 0) {
				it->link[i] = BAD_IDX;
				uint32_t next = m_vertex_edges[v0];
				m_vertex_edges[v0] = uint32_t(m_edges.size() & UINT32_MAX);
				m_edges.push_back(b_edge(v1, face_idx, next));
			} else {
				it->link[i] = edge->face0;
				if (!calc_smoothness) {
					++edge->size;
				} else {
					edge->smooth = (++edge->size == 2) ?
							it->is_edge_smooth(m_faces[edge->face0], v0, v1) : false;
				}
				edge->face0 = face_idx;
			}
		}
	}
}